

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O2

CordRepBtree * __thiscall
absl::lts_20250127::cord_internal::anon_unknown_0::
StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>::Unwind<false>
          (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0> *this,
          CordRepBtree *tree,int depth,size_t length,OpResult result)

{
  undefined1 auVar1 [12];
  size_t sVar2;
  CordRepBtree *pCVar3;
  size_t sVar4;
  CordRepBtree *this_00;
  int iVar5;
  ulong uVar6;
  StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0> *pSVar7;
  ulong uVar8;
  OpResult OVar9;
  OpResult OVar10;
  
  uVar6 = result._8_8_;
  pCVar3 = result.tree;
  sVar4 = length;
  if (depth != 0) {
    uVar8 = (ulong)(depth - 1);
    pSVar7 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0> *)
             (this->stack + (uVar8 - 1));
    sVar2 = (long)depth;
    do {
      sVar4 = sVar2;
      this_00 = this->stack[sVar4 - 1];
      iVar5 = (int)uVar6;
      if (iVar5 == 1) {
        OVar10 = CordRepBtree::SetEdge<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                           (this_00,(long)sVar4 <= (long)this->share_depth,&pCVar3->super_CordRep,
                            length);
        auVar1 = OVar10._0_12_;
LAB_003de9b7:
        pCVar3 = auVar1._0_8_;
        uVar6 = (ulong)auVar1._8_4_;
      }
      else {
        if (iVar5 == 2) {
          OVar9 = CordRepBtree::
                  AddEdge<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                            (this_00,(long)sVar4 <= (long)this->share_depth,&pCVar3->super_CordRep,
                             length);
          auVar1 = OVar9._0_12_;
          goto LAB_003de9b7;
        }
        if (iVar5 == 0) {
          while( true ) {
            (this_00->super_CordRep).length = (this_00->super_CordRep).length + length;
            if ((int)uVar8 < 1) break;
            this_00 = *(CordRepBtree **)pSVar7;
            pSVar7 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                      *)((long)(pSVar7 + 0xffffffffffffffff) + 0x60);
            uVar8 = (ulong)((int)uVar8 - 1);
          }
          return this_00;
        }
      }
      pSVar7 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0> *)
               ((long)(pSVar7 + 0xffffffffffffffff) + 0x60);
      uVar8 = (ulong)((int)uVar8 - 1);
      sVar2 = sVar4 - 1;
    } while (1 < (long)sVar4);
  }
  OVar9.tree = (CordRepBtree *)(uVar6 & 0xffffffff);
  OVar9._8_8_ = sVar4;
  pCVar3 = Finalize((StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0> *
                    )tree,pCVar3,OVar9);
  return pCVar3;
}

Assistant:

inline CordRepBtree* Unwind(CordRepBtree* tree, int depth, size_t length,
                              OpResult result) {
    // TODO(mvels): revisit the below code to check if 3 loops with 3
    // (incremental) conditions is faster than 1 loop with a switch.
    // Benchmarking and perf recordings indicate the loop with switch is
    // fastest, likely because of indirect jumps on the tight case values and
    // dense branches. But it's worth considering 3 loops, as the `action`
    // transitions are mono directional. E.g.:
    //   while (action == kPopped) {
    //     ...
    //   }
    //   while (action == kCopied) {
    //     ...
    //   }
    //   ...
    // We also  found that an "if () do {}" loop here seems faster, possibly
    // because it allows the branch predictor more granular heuristics on
    // 'single leaf' (`depth` == 0) and 'single depth' (`depth` == 1) cases
    // which appear to be the most common use cases.
    if (depth != 0) {
      do {
        CordRepBtree* node = stack[--depth];
        const bool owned = depth < share_depth;
        switch (result.action) {
          case CordRepBtree::kPopped:
            assert(!propagate);
            result = node->AddEdge<edge_type>(owned, result.tree, length);
            break;
          case CordRepBtree::kCopied:
            result = node->SetEdge<edge_type>(owned, result.tree, length);
            if (propagate) stack[depth] = result.tree;
            break;
          case CordRepBtree::kSelf:
            node->length += length;
            while (depth > 0) {
              node = stack[--depth];
              node->length += length;
            }
            return node;
        }
      } while (depth > 0);
    }
    return Finalize(tree, result);
  }